

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManGetDangling(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  bool bVar3;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vDangles;
  Gia_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0xffffffffbfffffff;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_20);
      if (iVar1 != 0) {
        pGVar2 = Gia_ObjFanin0(pGStack_20);
        *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      }
    }
    else {
      pGVar2 = Gia_ObjFanin0(pGStack_20);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      pGVar2 = Gia_ObjFanin1(pGStack_20);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
    }
    local_24 = local_24 + 1;
  }
  p_00 = Vec_IntAlloc(100);
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if ((iVar1 != 0) && ((*(ulong *)pGStack_20 >> 0x1e & 1) == 0)) {
      Vec_IntPush(p_00,local_24);
    }
    local_24 = local_24 + 1;
  }
  Gia_ManCleanMark0(p);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManGetDangling( Gia_Man_t * p )
{
    Vec_Int_t * vDangles;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    vDangles = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( p, pObj, i )
        if ( !pObj->fMark0 )
            Vec_IntPush( vDangles, i );
    Gia_ManCleanMark0( p );
    return vDangles;
}